

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O3

int evutil_fast_socket_closeonexec(int fd)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = fcntl(fd,2,1);
  if (iVar1 == -1) {
    event_warn("fcntl(%d, F_SETFD)",fd);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int
evutil_fast_socket_closeonexec(evutil_socket_t fd)
{
#if !defined(_WIN32) && defined(EVENT__HAVE_SETFD)
	if (fcntl(fd, F_SETFD, FD_CLOEXEC) == -1) {
		event_warn("fcntl(%d, F_SETFD)", fd);
		return -1;
	}
#endif
	return 0;
}